

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::setPositionForIndex(QListView *this,QPoint *position,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  long *plVar2;
  char cVar3;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((((*(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                  super_QWidgetPrivate.field_0x1c != 0) && (-1 < index->r)) && (-1 < index->c)) &&
     ((index->m).ptr == this_00->model)) {
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_38.r = -1;
      local_38.c = -1;
      local_38.i = 0;
      local_38.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(&local_38,pQVar1,index);
    }
    cVar3 = comparesEqual(&this_00->root,&local_38);
    if ((cVar3 != '\0') &&
       (index->c ==
        *(int *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                 super_QWidgetPrivate.field_0x50)) {
      if ((this_00->delayedPendingLayout == true) && (this_00->state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout(this_00);
        (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      plVar2 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                          super_QWidgetPrivate;
      (**(code **)(*plVar2 + 0x98))(plVar2,position,index);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::setPositionForIndex(const QPoint &position, const QModelIndex &index)
{
    Q_D(QListView);
    if (d->movement == Static
        || !d->isIndexValid(index)
        || index.parent() != d->root
        || index.column() != d->column)
        return;

    d->executePostedLayout();
    d->commonListView->setPositionForIndex(position, index);
}